

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCopyPixels.cpp
# Opt level: O2

void anon_unknown.dwarf_264f76::fillPixels(Array2D<half> *ph,int width,int height)

{
  ulong uVar1;
  int x;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  uVar4 = 0;
  uVar6 = (ulong)(uint)width;
  if (width < 1) {
    uVar6 = uVar4;
  }
  uVar1 = (ulong)(uint)height;
  if (height < 1) {
    uVar1 = uVar4;
  }
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    lVar3 = 0;
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      dVar7 = sin((double)(int)uVar2);
      dVar8 = sin((double)(int)uVar5 * 0.5);
      half::operator=((half *)((long)&ph->_data->_h + lVar3 + ph->_sizeY * uVar4),
                      (float)(dVar8 + dVar7));
      lVar3 = lVar3 + 2;
    }
    uVar4 = uVar4 + 2;
  }
  return;
}

Assistant:

void
fillPixels (Array2D<half> &ph, int width, int height)
{
    for (int y = 0; y < height; ++y)
	for (int x = 0; x < width; ++x)
	    ph[y][x] = sin (double (x)) + sin (y * 0.5);
}